

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-to-double.cc
# Opt level: O0

double __thiscall
double_conversion::StringToDoubleConverter::StringToIeee<unsigned_short_const*>
          (StringToDoubleConverter *this,unsigned_short *input,int length,bool read_as_double,
          int *processed_characters_count)

{
  Vector<const_char> trimmed;
  Vector<const_char> trimmed_00;
  ushort *puVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  ushort *puVar5;
  byte in_CL;
  ushort *puVar6;
  int in_EDX;
  ushort *in_RSI;
  uint *in_RDI;
  undefined4 *in_R8;
  uint uVar7;
  long in_FS_OFFSET;
  byte bVar8;
  undefined1 uVar9;
  byte bVar10;
  undefined1 uVar11;
  float fVar12;
  Vector<const_char> VVar13;
  double converted;
  double result_1;
  int digit;
  int num;
  int max_exponent;
  char exponen_sign;
  unsigned_short *junk_begin;
  int buffer_pos;
  int kBufferSize;
  bool octal;
  double result;
  bool parse_as_hex_float;
  bool leading_zero;
  bool sign;
  bool nonzero_digit_dropped;
  int insignificant_digits;
  int significant_digits;
  int exponent;
  bool allow_case_insensitivity;
  bool allow_spaces_after_sign;
  bool allow_trailing_spaces;
  bool allow_leading_spaces;
  bool allow_trailing_junk;
  char *start;
  bool result_is_junk_1;
  bool result_is_junk;
  unsigned_short *next_non_space;
  unsigned_short *end;
  unsigned_short *current;
  Vector<const_char> chars;
  char buffer [782];
  undefined4 in_stack_fffffffffffffb98;
  undefined1 in_stack_fffffffffffffb9c;
  undefined1 in_stack_fffffffffffffb9d;
  uc16 in_stack_fffffffffffffb9e;
  unsigned_short *in_stack_fffffffffffffba0;
  uc16 separator;
  unsigned_short **in_stack_fffffffffffffba8;
  undefined4 in_stack_fffffffffffffbb8;
  undefined4 in_stack_fffffffffffffbbc;
  int iVar14;
  undefined1 in_stack_fffffffffffffbc0;
  undefined1 in_stack_fffffffffffffbc1;
  undefined1 in_stack_fffffffffffffbc2;
  undefined1 in_stack_fffffffffffffbc3;
  undefined1 in_stack_fffffffffffffbc4;
  undefined1 uVar15;
  undefined1 uVar16;
  undefined1 in_stack_fffffffffffffbc7;
  undefined8 in_stack_fffffffffffffbc8;
  double local_420;
  int in_stack_fffffffffffffbf4;
  char in_stack_fffffffffffffbff;
  ushort *in_stack_fffffffffffffc00;
  undefined1 in_stack_fffffffffffffc0a;
  undefined1 in_stack_fffffffffffffc0b;
  undefined4 in_stack_fffffffffffffc0c;
  int iVar17;
  undefined4 in_stack_fffffffffffffc10;
  undefined4 uVar18;
  undefined4 in_stack_fffffffffffffc14;
  bool local_3dd;
  int local_3dc;
  int iVar19;
  int iVar20;
  undefined3 in_stack_fffffffffffffc30;
  undefined4 uVar21;
  bool *in_stack_fffffffffffffc58;
  ushort *local_370;
  char *in_stack_fffffffffffffcb0;
  char *pcVar22;
  undefined1 local_328 [16];
  char local_318 [784];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  puVar6 = in_RSI + in_EDX;
  *in_R8 = 0;
  bVar8 = (*in_RDI & 4) != 0;
  uVar9 = (*in_RDI & 8) != 0;
  bVar10 = (*in_RDI & 0x10) != 0;
  uVar11 = (*in_RDI & 0x20) != 0;
  uVar21 = CONCAT13((*in_RDI & 0x40) != 0,in_stack_fffffffffffffc30);
  if (in_RSI == puVar6) {
    local_420 = *(double *)(in_RDI + 2);
    goto LAB_0070b042;
  }
  if ((((bool)uVar9) || ((bool)bVar10)) &&
     (bVar2 = AdvanceToNonspace<unsigned_short_const*>
                        ((unsigned_short **)
                         CONCAT26(in_stack_fffffffffffffb9e,
                                  CONCAT15(in_stack_fffffffffffffb9d,
                                           CONCAT14(in_stack_fffffffffffffb9c,
                                                    in_stack_fffffffffffffb98))),
                         (unsigned_short *)0x709ebe), !bVar2)) {
    *in_R8 = 0;
    local_420 = *(double *)(in_RDI + 2);
    goto LAB_0070b042;
  }
  iVar20 = 0;
  iVar19 = 0;
  local_3dc = 0;
  local_3dd = false;
  bVar2 = false;
  if ((*in_RSI == 0x2b) || (local_370 = in_RSI, *in_RSI == 0x2d)) {
    bVar2 = *in_RSI == 0x2d;
    local_370 = in_RSI + 1;
    bVar3 = AdvanceToNonspace<unsigned_short_const*>
                      ((unsigned_short **)
                       CONCAT26(in_stack_fffffffffffffb9e,
                                CONCAT15(in_stack_fffffffffffffb9d,
                                         CONCAT14(in_stack_fffffffffffffb9c,
                                                  in_stack_fffffffffffffb98))),
                       (unsigned_short *)0x709fda);
    if (!bVar3) {
      local_420 = *(double *)(in_RDI + 4);
      goto LAB_0070b042;
    }
  }
  puVar1 = local_370;
  if ((*(long *)(in_RDI + 6) != 0) &&
     (bVar3 = anon_unknown_0::ConsumeFirstCharacter
                        ((char)((ulong)in_stack_fffffffffffffba0 >> 0x38),
                         (char *)CONCAT26(in_stack_fffffffffffffb9e,
                                          CONCAT15(in_stack_fffffffffffffb9d,
                                                   CONCAT14(in_stack_fffffffffffffb9c,
                                                            in_stack_fffffffffffffb98))),false),
     bVar3)) {
    bVar3 = (anonymous_namespace)::ConsumeSubString<unsigned_short_const*>
                      (in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,
                       (char *)CONCAT26(in_stack_fffffffffffffb9e,
                                        CONCAT15(in_stack_fffffffffffffb9d,
                                                 CONCAT14(in_stack_fffffffffffffb9c,
                                                          in_stack_fffffffffffffb98))),false);
    if (bVar3) {
      if ((((bVar10 & 1) == 0) && ((bVar8 & 1) == 0)) && (local_370 != puVar6)) {
        local_420 = *(double *)(in_RDI + 4);
      }
      else if (((bVar8 & 1) == 0) &&
              (bVar3 = AdvanceToNonspace<unsigned_short_const*>
                                 ((unsigned_short **)
                                  CONCAT26(in_stack_fffffffffffffb9e,
                                           CONCAT15(in_stack_fffffffffffffb9d,
                                                    CONCAT14(in_stack_fffffffffffffb9c,
                                                             in_stack_fffffffffffffb98))),
                                  (unsigned_short *)0x70a11e), bVar3)) {
        local_420 = *(double *)(in_RDI + 4);
      }
      else {
        *in_R8 = (int)((long)local_370 - (long)in_RSI >> 1);
        if (bVar2 == false) {
          local_420 = Double::Infinity();
        }
        else {
          local_420 = Double::Infinity();
          local_420 = -local_420;
        }
      }
    }
    else {
      local_420 = *(double *)(in_RDI + 4);
    }
    goto LAB_0070b042;
  }
  if ((*(long *)(in_RDI + 8) != 0) &&
     (bVar3 = anon_unknown_0::ConsumeFirstCharacter
                        ((char)((ulong)in_stack_fffffffffffffba0 >> 0x38),
                         (char *)CONCAT26(in_stack_fffffffffffffb9e,
                                          CONCAT15(in_stack_fffffffffffffb9d,
                                                   CONCAT14(in_stack_fffffffffffffb9c,
                                                            in_stack_fffffffffffffb98))),false),
     bVar3)) {
    bVar3 = (anonymous_namespace)::ConsumeSubString<unsigned_short_const*>
                      (in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,
                       (char *)CONCAT26(in_stack_fffffffffffffb9e,
                                        CONCAT15(in_stack_fffffffffffffb9d,
                                                 CONCAT14(in_stack_fffffffffffffb9c,
                                                          in_stack_fffffffffffffb98))),false);
    if (bVar3) {
      if ((((bVar10 & 1) == 0) && ((bVar8 & 1) == 0)) && (local_370 != puVar6)) {
        local_420 = *(double *)(in_RDI + 4);
      }
      else if (((bVar8 & 1) == 0) &&
              (bVar3 = AdvanceToNonspace<unsigned_short_const*>
                                 ((unsigned_short **)
                                  CONCAT26(in_stack_fffffffffffffb9e,
                                           CONCAT15(in_stack_fffffffffffffb9d,
                                                    CONCAT14(in_stack_fffffffffffffb9c,
                                                             in_stack_fffffffffffffb98))),
                                  (unsigned_short *)0x70a291), bVar3)) {
        local_420 = *(double *)(in_RDI + 4);
      }
      else {
        *in_R8 = (int)((long)local_370 - (long)in_RSI >> 1);
        if (bVar2 == false) {
          local_420 = Double::NaN();
        }
        else {
          local_420 = Double::NaN();
          local_420 = -local_420;
        }
      }
    }
    else {
      local_420 = *(double *)(in_RDI + 4);
    }
    goto LAB_0070b042;
  }
  bVar3 = false;
  if (*local_370 == 0x30) {
    bVar3 = Advance<unsigned_short_const*>
                      (in_stack_fffffffffffffba8,(uc16)((ulong)in_stack_fffffffffffffba0 >> 0x30),
                       (int)in_stack_fffffffffffffba0,
                       (unsigned_short **)
                       CONCAT26(in_stack_fffffffffffffb9e,
                                CONCAT15(in_stack_fffffffffffffb9d,
                                         CONCAT14(in_stack_fffffffffffffb9c,
                                                  in_stack_fffffffffffffb98))));
    if (bVar3) {
      *in_R8 = (int)((long)local_370 - (long)in_RSI >> 1);
      local_420 = SignedZero(bVar2);
    }
    else {
      bVar3 = true;
      if ((((*in_RDI & 1) == 0) && ((*in_RDI & 0x80) == 0)) ||
         ((*local_370 != 0x78 && (*local_370 != 0x58)))) {
        do {
          if (*local_370 != 0x30) goto LAB_0070a62c;
          bVar4 = Advance<unsigned_short_const*>
                            (in_stack_fffffffffffffba8,
                             (uc16)((ulong)in_stack_fffffffffffffba0 >> 0x30),
                             (int)in_stack_fffffffffffffba0,
                             (unsigned_short **)
                             CONCAT26(in_stack_fffffffffffffb9e,
                                      CONCAT15(in_stack_fffffffffffffb9d,
                                               CONCAT14(in_stack_fffffffffffffb9c,
                                                        in_stack_fffffffffffffb98))));
        } while (!bVar4);
        *in_R8 = (int)((long)local_370 - (long)in_RSI >> 1);
        local_420 = SignedZero(bVar2);
      }
      else {
        local_370 = local_370 + 1;
        if (local_370 == puVar6) {
          local_420 = *(double *)(in_RDI + 4);
        }
        else {
          bVar2 = false;
          if ((*in_RDI & 0x80) != 0) {
            bVar2 = IsHexFloatString<unsigned_short_const*>
                              (in_stack_fffffffffffffba0,
                               (unsigned_short *)
                               CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                               in_stack_fffffffffffffb9e,(bool)in_stack_fffffffffffffb9d);
          }
          if ((bVar2 != false) || (bVar2 = isDigit((uint)*local_370,0x10), bVar2)) {
            uVar7 = (uint)(in_CL & 1);
            local_420 = RadixStringToIeee<4,unsigned_short_const*>
                                  ((unsigned_short **)
                                   CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                                   (unsigned_short *)CONCAT44(iVar20,iVar19),
                                   SUB41((uint)in_stack_fffffffffffffc0c >> 0x18,0),
                                   (uc16)in_stack_fffffffffffffc0c,(bool)in_stack_fffffffffffffc0b,
                                   (bool)in_stack_fffffffffffffc0a,(double)in_stack_fffffffffffffc00
                                   ,(bool)in_stack_fffffffffffffbff,in_stack_fffffffffffffc58);
            if ((bVar10 & 1) != 0) {
              AdvanceToNonspace<unsigned_short_const*>
                        ((unsigned_short **)
                         CONCAT26(in_stack_fffffffffffffb9e,
                                  CONCAT15(in_stack_fffffffffffffb9d,
                                           CONCAT14(in_stack_fffffffffffffb9c,uVar7))),
                         (unsigned_short *)0x70a573);
            }
            *in_R8 = (int)((long)local_370 - (long)in_RSI >> 1);
          }
          else {
            local_420 = *(double *)(in_RDI + 4);
          }
        }
      }
    }
    goto LAB_0070b042;
  }
LAB_0070a62c:
  uVar16 = false;
  if (bVar3) {
    uVar16 = (*in_RDI & 2) != 0;
  }
  uVar7 = CONCAT13(uVar16,(int3)in_stack_fffffffffffffc14);
  uVar18 = 0x30e;
  iVar17 = 0;
  do {
    uVar15 = false;
    if (0x2f < *local_370) {
      uVar15 = *local_370 < 0x3a;
    }
    separator = (uc16)((ulong)in_stack_fffffffffffffba0 >> 0x30);
    if ((bool)uVar15 == false) {
      if (iVar19 == 0) {
        uVar7 = uVar7 & 0xffffff;
      }
      if (*local_370 != 0x2e) goto LAB_0070a9d5;
      if (((uVar7 & 0x1000000) != 0) && ((bVar8 & 1) == 0)) {
        local_420 = *(double *)(in_RDI + 4);
        goto LAB_0070b042;
      }
      local_370 = puVar1;
      if ((uVar7 & 0x1000000) == 0) {
        bVar4 = Advance<unsigned_short_const*>
                          (in_stack_fffffffffffffba8,separator,(int)in_stack_fffffffffffffba0,
                           (unsigned_short **)
                           CONCAT26(in_stack_fffffffffffffb9e,
                                    CONCAT15(in_stack_fffffffffffffb9d,
                                             CONCAT14(in_stack_fffffffffffffb9c,
                                                      in_stack_fffffffffffffb98))));
        if (!bVar4) {
          if (iVar19 != 0) goto LAB_0070a8e2;
          goto LAB_0070a84a;
        }
        if ((iVar19 == 0) && (!bVar3)) {
          local_420 = *(double *)(in_RDI + 4);
          goto LAB_0070b042;
        }
      }
      break;
    }
    if (iVar19 < 0x304) {
      local_318[iVar17] = (char)*local_370;
      iVar19 = iVar19 + 1;
      iVar17 = iVar17 + 1;
    }
    else {
      local_3dc = local_3dc + 1;
      bVar4 = local_3dd == false;
      in_stack_fffffffffffffbc4 = true;
      local_3dd = (bool)in_stack_fffffffffffffbc4;
      if (bVar4) {
        in_stack_fffffffffffffbc4 = *local_370 != 0x30;
        local_3dd = (bool)in_stack_fffffffffffffbc4;
      }
    }
    in_stack_fffffffffffffbc3 = false;
    if ((uVar7 & 0x1000000) != 0) {
      in_stack_fffffffffffffbc3 = *local_370 < 0x38;
    }
    uVar7 = CONCAT13(in_stack_fffffffffffffbc3,(int3)uVar7);
    bVar4 = Advance<unsigned_short_const*>
                      (in_stack_fffffffffffffba8,separator,(int)in_stack_fffffffffffffba0,
                       (unsigned_short **)
                       CONCAT26(in_stack_fffffffffffffb9e,
                                CONCAT15(in_stack_fffffffffffffb9d,
                                         CONCAT14(in_stack_fffffffffffffb9c,
                                                  in_stack_fffffffffffffb98))));
    local_370 = puVar1;
  } while (!bVar4);
  goto LAB_0070ad44;
LAB_0070a84a:
  if (*local_370 != 0x30) goto LAB_0070a8e2;
  bVar4 = Advance<unsigned_short_const*>
                    (in_stack_fffffffffffffba8,(uc16)((ulong)in_stack_fffffffffffffba0 >> 0x30),
                     (int)in_stack_fffffffffffffba0,
                     (unsigned_short **)
                     CONCAT26(in_stack_fffffffffffffb9e,
                              CONCAT15(in_stack_fffffffffffffb9d,
                                       CONCAT14(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98)
                                      )));
  if (bVar4) {
    *in_R8 = (int)((long)local_370 - (long)in_RSI >> 1);
    local_420 = SignedZero(bVar2);
    goto LAB_0070b042;
  }
  iVar20 = iVar20 + -1;
  goto LAB_0070a84a;
LAB_0070a9d5:
  if (((!bVar3) && (iVar20 == 0)) && (iVar19 == 0)) {
    local_420 = *(double *)(in_RDI + 4);
    goto LAB_0070b042;
  }
  if ((*local_370 == 0x65) || (*local_370 == 0x45)) {
    if (((uVar7 & 0x1000000) != 0) && ((bVar8 & 1) == 0)) {
      local_420 = *(double *)(in_RDI + 4);
      goto LAB_0070b042;
    }
    local_370 = puVar1;
    if ((uVar7 & 0x1000000) == 0) {
      puVar5 = local_370 + 1;
      in_stack_fffffffffffffc00 = puVar1;
      if (puVar5 == puVar6) {
        if ((bVar8 & 1) == 0) {
          local_420 = *(double *)(in_RDI + 4);
          goto LAB_0070b042;
        }
      }
      else {
        in_stack_fffffffffffffbff = '+';
        if ((*puVar5 == 0x2b) || (*puVar5 == 0x2d)) {
          in_stack_fffffffffffffbff = (char)*puVar5;
          puVar5 = local_370 + 2;
          if (local_370 + 2 == puVar6) {
            if ((bVar8 & 1) == 0) {
              local_420 = *(double *)(in_RDI + 4);
              goto LAB_0070b042;
            }
            goto LAB_0070ad44;
          }
        }
        local_370 = puVar5;
        if (((local_370 != puVar6) && (0x2f < *local_370)) && (*local_370 < 0x3a)) {
          in_stack_fffffffffffffbf4 = 0;
          do {
            if ((in_stack_fffffffffffffbf4 < 0x6666666) ||
               ((in_stack_fffffffffffffbf4 == 0x6666666 && ((int)(*local_370 - 0x30) < 4)))) {
              in_stack_fffffffffffffbf4 = in_stack_fffffffffffffbf4 * 10 + (*local_370 - 0x30);
            }
            else {
              in_stack_fffffffffffffbf4 = 0x3fffffff;
            }
            local_370 = local_370 + 1;
            bVar3 = false;
            if ((local_370 != puVar6) && (bVar3 = false, 0x2f < *local_370)) {
              bVar3 = *local_370 < 0x3a;
            }
          } while (bVar3);
          iVar14 = in_stack_fffffffffffffbf4;
          if (in_stack_fffffffffffffbff == '-') {
            iVar14 = -in_stack_fffffffffffffbf4;
          }
          iVar20 = iVar14 + iVar20;
          in_stack_fffffffffffffbc0 = 0;
          goto LAB_0070aca8;
        }
        local_370 = puVar1;
        if ((bVar8 & 1) == 0) {
          local_420 = *(double *)(in_RDI + 4);
          goto LAB_0070b042;
        }
      }
    }
  }
  else {
LAB_0070aca8:
    if ((((bVar10 & 1) == 0) && ((bVar8 & 1) == 0)) && (local_370 != puVar6)) {
      local_420 = *(double *)(in_RDI + 4);
      goto LAB_0070b042;
    }
    if (((bVar8 & 1) == 0) &&
       (bVar3 = AdvanceToNonspace<unsigned_short_const*>
                          ((unsigned_short **)
                           CONCAT26(in_stack_fffffffffffffb9e,
                                    CONCAT15(in_stack_fffffffffffffb9d,
                                             CONCAT14(in_stack_fffffffffffffb9c,
                                                      in_stack_fffffffffffffb98))),
                           (unsigned_short *)0x70ad05), bVar3)) {
      local_420 = *(double *)(in_RDI + 4);
      goto LAB_0070b042;
    }
    if ((bVar10 & 1) != 0) {
      AdvanceToNonspace<unsigned_short_const*>
                ((unsigned_short **)
                 CONCAT26(in_stack_fffffffffffffb9e,
                          CONCAT15(in_stack_fffffffffffffb9d,
                                   CONCAT14(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98))),
                 (unsigned_short *)0x70ad42);
    }
  }
  goto LAB_0070ad44;
  while( true ) {
    if (iVar19 < 0x304) {
      local_318[iVar17] = (char)*local_370;
      iVar19 = iVar19 + 1;
      iVar20 = iVar20 + -1;
      iVar17 = iVar17 + 1;
    }
    else {
      bVar4 = local_3dd == false;
      in_stack_fffffffffffffbc1 = true;
      local_3dd = (bool)in_stack_fffffffffffffbc1;
      if (bVar4) {
        in_stack_fffffffffffffbc1 = *local_370 != 0x30;
        local_3dd = (bool)in_stack_fffffffffffffbc1;
      }
    }
    bVar4 = Advance<unsigned_short_const*>
                      (in_stack_fffffffffffffba8,(uc16)((ulong)in_stack_fffffffffffffba0 >> 0x30),
                       (int)in_stack_fffffffffffffba0,
                       (unsigned_short **)
                       CONCAT26(in_stack_fffffffffffffb9e,
                                CONCAT15(in_stack_fffffffffffffb9d,
                                         CONCAT14(in_stack_fffffffffffffb9c,
                                                  in_stack_fffffffffffffb98))));
    if (bVar4) break;
LAB_0070a8e2:
    in_stack_fffffffffffffbc2 = false;
    if (0x2f < *local_370) {
      in_stack_fffffffffffffbc2 = *local_370 < 0x3a;
    }
    if ((bool)in_stack_fffffffffffffbc2 == false) goto LAB_0070a9d5;
  }
LAB_0070ad44:
  iVar14 = (int)((ulong)in_stack_fffffffffffffba8 >> 0x20);
  if ((uVar7 & 0x1000000) == 0) {
    iVar19 = iVar17;
    if (local_3dd != false) {
      iVar19 = iVar17 + 1;
      local_318[iVar17] = '1';
    }
    local_318[iVar19] = '\0';
    local_328._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_328._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    Vector<const_char>::Vector((Vector<const_char> *)local_328,local_318,iVar19);
    VVar13.start_._1_1_ = in_stack_fffffffffffffbc1;
    VVar13.start_._0_1_ = in_stack_fffffffffffffbc0;
    VVar13.start_._2_1_ = in_stack_fffffffffffffbc2;
    VVar13.start_._3_1_ = in_stack_fffffffffffffbc3;
    VVar13.start_._4_1_ = in_stack_fffffffffffffbc4;
    VVar13.start_._5_1_ = uVar15;
    VVar13.start_._6_1_ = uVar16;
    VVar13.start_._7_1_ = in_stack_fffffffffffffbc7;
    VVar13._8_8_ = in_stack_fffffffffffffbc8;
    VVar13 = TrimTrailingZeros(VVar13);
    local_328._8_4_ = VVar13.length_;
    pcVar22 = (char *)local_328._0_8_;
    local_328._0_8_ = VVar13.start_;
    Vector<const_char>::length((Vector<const_char> *)local_328);
    if ((in_CL & 1) == 0) {
      trimmed_00._8_8_ = pcVar22;
      trimmed_00.start_ = in_stack_fffffffffffffcb0;
      fVar12 = StrtofTrimmed(trimmed_00,in_stack_fffffffffffffbf4);
      local_420 = (double)fVar12;
    }
    else {
      trimmed.start_._4_1_ = uVar11;
      trimmed.start_._0_4_ = uVar21;
      trimmed.start_._5_1_ = bVar10;
      trimmed.start_._6_1_ = uVar9;
      trimmed.start_._7_1_ = bVar8;
      trimmed._8_8_ = in_R8;
      local_420 = StrtodTrimmed(trimmed,iVar14);
    }
    *in_R8 = (int)((long)local_370 - (long)in_RSI >> 1);
    if (bVar2 != false) {
      local_420 = -local_420;
    }
  }
  else {
    local_420 = RadixStringToIeee<3,char*>
                          ((char **)CONCAT44(uVar7,uVar18),
                           (char *)CONCAT44(local_3dc + iVar20,iVar19),SUB41((uint)iVar17 >> 0x18,0)
                           ,(uc16)iVar17,(bool)in_stack_fffffffffffffc0b,
                           (bool)in_stack_fffffffffffffc0a,(double)in_stack_fffffffffffffc00,
                           (bool)in_stack_fffffffffffffbff,in_stack_fffffffffffffc58);
    *in_R8 = (int)((long)local_370 - (long)in_RSI >> 1);
  }
LAB_0070b042:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_420;
}

Assistant:

double StringToDoubleConverter::StringToIeee(
    Iterator input,
    int length,
    bool read_as_double,
    int* processed_characters_count) const {
  Iterator current = input;
  Iterator end = input + length;

  *processed_characters_count = 0;

  const bool allow_trailing_junk = (flags_ & ALLOW_TRAILING_JUNK) != 0;
  const bool allow_leading_spaces = (flags_ & ALLOW_LEADING_SPACES) != 0;
  const bool allow_trailing_spaces = (flags_ & ALLOW_TRAILING_SPACES) != 0;
  const bool allow_spaces_after_sign = (flags_ & ALLOW_SPACES_AFTER_SIGN) != 0;
  const bool allow_case_insensitivity = (flags_ & ALLOW_CASE_INSENSITIVITY) != 0;

  // To make sure that iterator dereferencing is valid the following
  // convention is used:
  // 1. Each '++current' statement is followed by check for equality to 'end'.
  // 2. If AdvanceToNonspace returned false then current == end.
  // 3. If 'current' becomes equal to 'end' the function returns or goes to
  // 'parsing_done'.
  // 4. 'current' is not dereferenced after the 'parsing_done' label.
  // 5. Code before 'parsing_done' may rely on 'current != end'.
  if (current == end) return empty_string_value_;

  if (allow_leading_spaces || allow_trailing_spaces) {
    if (!AdvanceToNonspace(&current, end)) {
      *processed_characters_count = static_cast<int>(current - input);
      return empty_string_value_;
    }
    if (!allow_leading_spaces && (input != current)) {
      // No leading spaces allowed, but AdvanceToNonspace moved forward.
      return junk_string_value_;
    }
  }

  // Exponent will be adjusted if insignificant digits of the integer part
  // or insignificant leading zeros of the fractional part are dropped.
  int exponent = 0;
  int significant_digits = 0;
  int insignificant_digits = 0;
  bool nonzero_digit_dropped = false;

  bool sign = false;

  if (*current == '+' || *current == '-') {
    sign = (*current == '-');
    ++current;
    Iterator next_non_space = current;
    // Skip following spaces (if allowed).
    if (!AdvanceToNonspace(&next_non_space, end)) return junk_string_value_;
    if (!allow_spaces_after_sign && (current != next_non_space)) {
      return junk_string_value_;
    }
    current = next_non_space;
  }

  if (infinity_symbol_ != DOUBLE_CONVERSION_NULLPTR) {
    if (ConsumeFirstCharacter(*current, infinity_symbol_, allow_case_insensitivity)) {
      if (!ConsumeSubString(&current, end, infinity_symbol_, allow_case_insensitivity)) {
        return junk_string_value_;
      }

      if (!(allow_trailing_spaces || allow_trailing_junk) && (current != end)) {
        return junk_string_value_;
      }
      if (!allow_trailing_junk && AdvanceToNonspace(&current, end)) {
        return junk_string_value_;
      }

      *processed_characters_count = static_cast<int>(current - input);
      return sign ? -Double::Infinity() : Double::Infinity();
    }
  }

  if (nan_symbol_ != DOUBLE_CONVERSION_NULLPTR) {
    if (ConsumeFirstCharacter(*current, nan_symbol_, allow_case_insensitivity)) {
      if (!ConsumeSubString(&current, end, nan_symbol_, allow_case_insensitivity)) {
        return junk_string_value_;
      }

      if (!(allow_trailing_spaces || allow_trailing_junk) && (current != end)) {
        return junk_string_value_;
      }
      if (!allow_trailing_junk && AdvanceToNonspace(&current, end)) {
        return junk_string_value_;
      }

      *processed_characters_count = static_cast<int>(current - input);
      return sign ? -Double::NaN() : Double::NaN();
    }
  }

  bool leading_zero = false;
  if (*current == '0') {
    if (Advance(&current, separator_, 10, end)) {
      *processed_characters_count = static_cast<int>(current - input);
      return SignedZero(sign);
    }

    leading_zero = true;

    // It could be hexadecimal value.
    if (((flags_ & ALLOW_HEX) || (flags_ & ALLOW_HEX_FLOATS)) &&
        (*current == 'x' || *current == 'X')) {
      ++current;

      if (current == end) return junk_string_value_;  // "0x"

      bool parse_as_hex_float = (flags_ & ALLOW_HEX_FLOATS) &&
                IsHexFloatString(current, end, separator_, allow_trailing_junk);

      if (!parse_as_hex_float && !isDigit(*current, 16)) {
        return junk_string_value_;
      }

      bool result_is_junk;
      double result = RadixStringToIeee<4>(&current,
                                           end,
                                           sign,
                                           separator_,
                                           parse_as_hex_float,
                                           allow_trailing_junk,
                                           junk_string_value_,
                                           read_as_double,
                                           &result_is_junk);
      if (!result_is_junk) {
        if (allow_trailing_spaces) AdvanceToNonspace(&current, end);
        *processed_characters_count = static_cast<int>(current - input);
      }
      return result;
    }

    // Ignore leading zeros in the integer part.
    while (*current == '0') {
      if (Advance(&current, separator_, 10, end)) {
        *processed_characters_count = static_cast<int>(current - input);
        return SignedZero(sign);
      }
    }
  }

  bool octal = leading_zero && (flags_ & ALLOW_OCTALS) != 0;

  // The longest form of simplified number is: "-<significant digits>.1eXXX\0".
  const int kBufferSize = kMaxSignificantDigits + 10;
  DOUBLE_CONVERSION_STACK_UNINITIALIZED char
      buffer[kBufferSize];  // NOLINT: size is known at compile time.
  int buffer_pos = 0;

  // Copy significant digits of the integer part (if any) to the buffer.
  while (*current >= '0' && *current <= '9') {
    if (significant_digits < kMaxSignificantDigits) {
      DOUBLE_CONVERSION_ASSERT(buffer_pos < kBufferSize);
      buffer[buffer_pos++] = static_cast<char>(*current);
      significant_digits++;
      // Will later check if it's an octal in the buffer.
    } else {
      insignificant_digits++;  // Move the digit into the exponential part.
      nonzero_digit_dropped = nonzero_digit_dropped || *current != '0';
    }
    octal = octal && *current < '8';
    if (Advance(&current, separator_, 10, end)) goto parsing_done;
  }

  if (significant_digits == 0) {
    octal = false;
  }

  if (*current == '.') {
    if (octal && !allow_trailing_junk) return junk_string_value_;
    if (octal) goto parsing_done;

    if (Advance(&current, separator_, 10, end)) {
      if (significant_digits == 0 && !leading_zero) {
        return junk_string_value_;
      } else {
        goto parsing_done;
      }
    }

    if (significant_digits == 0) {
      // octal = false;
      // Integer part consists of 0 or is absent. Significant digits start after
      // leading zeros (if any).
      while (*current == '0') {
        if (Advance(&current, separator_, 10, end)) {
          *processed_characters_count = static_cast<int>(current - input);
          return SignedZero(sign);
        }
        exponent--;  // Move this 0 into the exponent.
      }
    }

    // There is a fractional part.
    // We don't emit a '.', but adjust the exponent instead.
    while (*current >= '0' && *current <= '9') {
      if (significant_digits < kMaxSignificantDigits) {
        DOUBLE_CONVERSION_ASSERT(buffer_pos < kBufferSize);
        buffer[buffer_pos++] = static_cast<char>(*current);
        significant_digits++;
        exponent--;
      } else {
        // Ignore insignificant digits in the fractional part.
        nonzero_digit_dropped = nonzero_digit_dropped || *current != '0';
      }
      if (Advance(&current, separator_, 10, end)) goto parsing_done;
    }
  }

  if (!leading_zero && exponent == 0 && significant_digits == 0) {
    // If leading_zeros is true then the string contains zeros.
    // If exponent < 0 then string was [+-]\.0*...
    // If significant_digits != 0 the string is not equal to 0.
    // Otherwise there are no digits in the string.
    return junk_string_value_;
  }

  // Parse exponential part.
  if (*current == 'e' || *current == 'E') {
    if (octal && !allow_trailing_junk) return junk_string_value_;
    if (octal) goto parsing_done;
    Iterator junk_begin = current;
    ++current;
    if (current == end) {
      if (allow_trailing_junk) {
        current = junk_begin;
        goto parsing_done;
      } else {
        return junk_string_value_;
      }
    }
    char exponen_sign = '+';
    if (*current == '+' || *current == '-') {
      exponen_sign = static_cast<char>(*current);
      ++current;
      if (current == end) {
        if (allow_trailing_junk) {
          current = junk_begin;
          goto parsing_done;
        } else {
          return junk_string_value_;
        }
      }
    }

    if (current == end || *current < '0' || *current > '9') {
      if (allow_trailing_junk) {
        current = junk_begin;
        goto parsing_done;
      } else {
        return junk_string_value_;
      }
    }

    const int max_exponent = INT_MAX / 2;
    DOUBLE_CONVERSION_ASSERT(-max_exponent / 2 <= exponent && exponent <= max_exponent / 2);
    int num = 0;
    do {
      // Check overflow.
      int digit = *current - '0';
      if (num >= max_exponent / 10
          && !(num == max_exponent / 10 && digit <= max_exponent % 10)) {
        num = max_exponent;
      } else {
        num = num * 10 + digit;
      }
      ++current;
    } while (current != end && *current >= '0' && *current <= '9');

    exponent += (exponen_sign == '-' ? -num : num);
  }

  if (!(allow_trailing_spaces || allow_trailing_junk) && (current != end)) {
    return junk_string_value_;
  }
  if (!allow_trailing_junk && AdvanceToNonspace(&current, end)) {
    return junk_string_value_;
  }
  if (allow_trailing_spaces) {
    AdvanceToNonspace(&current, end);
  }

  parsing_done:
  exponent += insignificant_digits;

  if (octal) {
    double result;
    bool result_is_junk;
    char* start = buffer;
    result = RadixStringToIeee<3>(&start,
                                  buffer + buffer_pos,
                                  sign,
                                  separator_,
                                  false, // Don't parse as hex_float.
                                  allow_trailing_junk,
                                  junk_string_value_,
                                  read_as_double,
                                  &result_is_junk);
    DOUBLE_CONVERSION_ASSERT(!result_is_junk);
    *processed_characters_count = static_cast<int>(current - input);
    return result;
  }

  if (nonzero_digit_dropped) {
    buffer[buffer_pos++] = '1';
    exponent--;
  }

  DOUBLE_CONVERSION_ASSERT(buffer_pos < kBufferSize);
  buffer[buffer_pos] = '\0';

  // Code above ensures there are no leading zeros and the buffer has fewer than
  // kMaxSignificantDecimalDigits characters. Trim trailing zeros.
  Vector<const char> chars(buffer, buffer_pos);
  chars = TrimTrailingZeros(chars);
  exponent += buffer_pos - chars.length();

  double converted;
  if (read_as_double) {
    converted = StrtodTrimmed(chars, exponent);
  } else {
    converted = StrtofTrimmed(chars, exponent);
  }
  *processed_characters_count = static_cast<int>(current - input);
  return sign? -converted: converted;
}